

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

bool __thiscall absl::lts_20250127::Cord::Contains(Cord *this,Cord *rhs)

{
  ulong uVar1;
  CharIterator local_a0;
  
  uVar1 = (ulong)(rhs->contents_).data_.rep_.field_0.data[0];
  if ((uVar1 & 1) == 0) {
    uVar1 = uVar1 >> 1;
  }
  else {
    uVar1 = ((rhs->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar1 != 0) {
    Find(&local_a0,this,rhs);
    return local_a0.chunk_iterator_.bytes_remaining_ != 0;
  }
  return true;
}

Assistant:

bool Cord::Contains(const absl::Cord& rhs) const {
  return rhs.empty() || Find(rhs) != char_end();
}